

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void quit_altrace_record(void)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  uint32 local_20 [2];
  uint32 ticks;
  uint32 eos;
  pthread_mutex_t *mutex;
  int io;
  
  mutex._4_4_ = logfd;
  _ticks = apilock;
  logfd = -1;
  apilock = (pthread_mutex_t *)0x0;
  fprintf(_stderr,"%s: Shutting down...\n",GAppName);
  fflush(_stderr);
  if (mutex._4_4_ != -1) {
    local_20[1] = 0;
    local_20[0] = now();
    sVar4 = write(mutex._4_4_,local_20 + 1,4);
    if ((sVar4 != 4) || (sVar4 = write(mutex._4_4_,local_20,4), sVar4 != 4)) {
      pFVar2 = _stderr;
      pcVar1 = GAppName;
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar2,"%s: Failed to write EOS to OpenAL log file: %s\n",pcVar1,pcVar6);
    }
    iVar3 = close(mutex._4_4_);
    pFVar2 = _stderr;
    pcVar1 = GAppName;
    if (iVar3 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar2,"%s: Failed to close OpenAL log file: %s\n",pcVar1,pcVar6);
    }
  }
  if (_ticks != (pthread_mutex_t *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)_ticks);
  }
  REAL_alcGetCurrentContext = (_func_ALCcontext_ptr *)0x0;
  REAL_alcGetContextsDevice = (_func_ALCdevice_ptr_ALCcontext_ptr *)0x0;
  REAL_alcIsExtensionPresent = (_func_ALCboolean_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcGetProcAddress = (_func_void_ptr_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcGetEnumValue = (_func_ALCenum_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcGetString = (_func_ALCchar_ptr_ALCdevice_ptr_ALCenum *)0x0;
  REAL_alcCaptureOpenDevice = (_func_ALCdevice_ptr_ALCchar_ptr_ALCuint_ALCenum_ALCsizei *)0x0;
  REAL_alcCaptureCloseDevice = (_func_ALCboolean_ALCdevice_ptr *)0x0;
  REAL_alcOpenDevice = (_func_ALCdevice_ptr_ALCchar_ptr *)0x0;
  REAL_alcCloseDevice = (_func_ALCboolean_ALCdevice_ptr *)0x0;
  REAL_alcCreateContext = (_func_ALCcontext_ptr_ALCdevice_ptr_ALCint_ptr *)0x0;
  REAL_alcMakeContextCurrent = (_func_ALCboolean_ALCcontext_ptr *)0x0;
  REAL_alcProcessContext = (_func_void_ALCcontext_ptr *)0x0;
  REAL_alcSuspendContext = (_func_void_ALCcontext_ptr *)0x0;
  REAL_alcDestroyContext = (_func_void_ALCcontext_ptr *)0x0;
  REAL_alcGetError = (_func_ALCenum_ALCdevice_ptr *)0x0;
  REAL_alcGetIntegerv = (_func_void_ALCdevice_ptr_ALCenum_ALCsizei_ALCint_ptr *)0x0;
  REAL_alcCaptureStart = (_func_void_ALCdevice_ptr *)0x0;
  REAL_alcCaptureStop = (_func_void_ALCdevice_ptr *)0x0;
  REAL_alcCaptureSamples = (_func_void_ALCdevice_ptr_ALCvoid_ptr_ALCsizei *)0x0;
  REAL_alDopplerFactor = (_func_void_ALfloat *)0x0;
  REAL_alDopplerVelocity = (_func_void_ALfloat *)0x0;
  REAL_alSpeedOfSound = (_func_void_ALfloat *)0x0;
  REAL_alDistanceModel = (_func_void_ALenum *)0x0;
  REAL_alEnable = (_func_void_ALenum *)0x0;
  REAL_alDisable = (_func_void_ALenum *)0x0;
  REAL_alIsEnabled = (_func_ALboolean_ALenum *)0x0;
  REAL_alGetString = (_func_ALchar_ptr_ALenum *)0x0;
  REAL_alGetBooleanv = (_func_void_ALenum_ALboolean_ptr *)0x0;
  REAL_alGetIntegerv = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alGetFloatv = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetDoublev = (_func_void_ALenum_ALdouble_ptr *)0x0;
  REAL_alGetBoolean = (_func_ALboolean_ALenum *)0x0;
  REAL_alGetInteger = (_func_ALint_ALenum *)0x0;
  REAL_alGetFloat = (_func_ALfloat_ALenum *)0x0;
  REAL_alGetDouble = (_func_ALdouble_ALenum *)0x0;
  REAL_alIsExtensionPresent = (_func_ALboolean_ALchar_ptr *)0x0;
  REAL_alGetError = (_func_ALenum *)0x0;
  REAL_alGetProcAddress = (_func_void_ptr_ALchar_ptr *)0x0;
  REAL_alGetEnumValue = (_func_ALenum_ALchar_ptr *)0x0;
  REAL_alListenerfv = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alListenerf = (_func_void_ALenum_ALfloat *)0x0;
  REAL_alListener3f = (_func_void_ALenum_ALfloat_ALfloat_ALfloat *)0x0;
  REAL_alListeneriv = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alListeneri = (_func_void_ALenum_ALint *)0x0;
  REAL_alListener3i = (_func_void_ALenum_ALint_ALint_ALint *)0x0;
  REAL_alGetListenerfv = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetListenerf = (_func_void_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetListener3f = (_func_void_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)0x0;
  REAL_alGetListeneri = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alGetListeneriv = (_func_void_ALenum_ALint_ptr *)0x0;
  REAL_alGetListener3i = (_func_void_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)0x0;
  REAL_alGenSources = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alDeleteSources = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alIsSource = (_func_ALboolean_ALuint *)0x0;
  REAL_alSourcefv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alSourcef = (_func_void_ALuint_ALenum_ALfloat *)0x0;
  REAL_alSource3f = (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)0x0;
  REAL_alSourceiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alSourcei = (_func_void_ALuint_ALenum_ALint *)0x0;
  REAL_alSource3i = (_func_void_ALuint_ALenum_ALint_ALint_ALint *)0x0;
  REAL_alGetSourcefv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetSourcef = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetSource3f = (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)0x0;
  REAL_alGetSourceiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alGetSourcei = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alGetSource3i = (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)0x0;
  REAL_alSourcePlay = (_func_void_ALuint *)0x0;
  REAL_alSourcePlayv = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourcePause = (_func_void_ALuint *)0x0;
  REAL_alSourcePausev = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceRewind = (_func_void_ALuint *)0x0;
  REAL_alSourceRewindv = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceStop = (_func_void_ALuint *)0x0;
  REAL_alSourceStopv = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceQueueBuffers = (_func_void_ALuint_ALsizei_ALuint_ptr *)0x0;
  REAL_alSourceUnqueueBuffers = (_func_void_ALuint_ALsizei_ALuint_ptr *)0x0;
  REAL_alGenBuffers = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alDeleteBuffers = (_func_void_ALsizei_ALuint_ptr *)0x0;
  REAL_alIsBuffer = (_func_ALboolean_ALuint *)0x0;
  REAL_alBufferData = (_func_void_ALuint_ALenum_ALvoid_ptr_ALsizei_ALsizei *)0x0;
  REAL_alBufferfv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alBufferf = (_func_void_ALuint_ALenum_ALfloat *)0x0;
  REAL_alBuffer3f = (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)0x0;
  REAL_alBufferiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alBufferi = (_func_void_ALuint_ALenum_ALint *)0x0;
  REAL_alBuffer3i = (_func_void_ALuint_ALenum_ALint_ALint_ALint *)0x0;
  REAL_alGetBufferfv = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetBufferf = (_func_void_ALuint_ALenum_ALfloat_ptr *)0x0;
  REAL_alGetBuffer3f = (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)0x0;
  REAL_alGetBufferi = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alGetBuffer3i = (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)0x0;
  REAL_alGetBufferiv = (_func_void_ALuint_ALenum_ALint_ptr *)0x0;
  REAL_alTracePushScope = (_func_void_ALchar_ptr *)0x0;
  REAL_alTracePopScope = (_func_void *)0x0;
  REAL_alTraceMessage = (_func_void_ALchar_ptr *)0x0;
  REAL_alTraceBufferLabel = (_func_void_ALuint_ALchar_ptr *)0x0;
  REAL_alTraceSourceLabel = (_func_void_ALuint_ALchar_ptr *)0x0;
  REAL_alcTraceDeviceLabel = (_func_void_ALCdevice_ptr_ALchar_ptr *)0x0;
  REAL_alcTraceContextLabel = (_func_void_ALCcontext_ptr_ALchar_ptr *)0x0;
  close_real_openal();
  free_stackframe_map();
  fflush(_stderr);
  return;
}

Assistant:

static void quit_altrace_record(void)
{
    const int io = logfd;
    pthread_mutex_t *mutex = apilock;

    logfd = -1;
    apilock = NULL;

    fprintf(stderr, "%s: Shutting down...\n", GAppName);
    fflush(stderr);

    if (io != -1) {
        const uint32 eos = swap32((uint32) ALEE_EOS);
        const uint32 ticks = swap32(now());
        if ((write(io, &eos, 4) != 4) || (write(io, &ticks, 4) != 4)) {
            fprintf(stderr, "%s: Failed to write EOS to OpenAL log file: %s\n", GAppName, strerror(errno));
        }
        if (close(io) < 0) {
            fprintf(stderr, "%s: Failed to close OpenAL log file: %s\n", GAppName, strerror(errno));
        }
    }

    if (mutex) {
        pthread_mutex_destroy(mutex);
    }

    #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) REAL_##name = NULL;
    #include "altrace_entrypoints.h"

    close_real_openal();
    free_stackframe_map();

    fflush(stderr);
}